

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::anon_unknown_160::PropagateAssetResolverState
               (uint32_t depth,PrimSpec *ps,string *cwp,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *search_paths)

{
  pointer pPVar1;
  bool bVar2;
  PrimSpec *child;
  pointer ps_00;
  bool bVar3;
  
  if (depth < 0x20000001) {
    PrimSpec::set_asset_resolution_state
              (ps,(string *)cwp,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)search_paths);
    ps_00 = (ps->_children).
            super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
            super__Vector_impl_data._M_start;
    pPVar1 = (ps->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      bVar3 = ps_00 == pPVar1;
      if (bVar3) {
        return bVar3;
      }
      bVar2 = PropagateAssetResolverState(depth + 1,ps_00,cwp,search_paths);
      ps_00 = ps_00 + 1;
    } while (bVar2);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool PropagateAssetResolverState(uint32_t depth, PrimSpec &ps,
                                 const std::string &cwp,
                                 const std::vector<std::string> &search_paths) {
  if (depth > (1024 * 1024 * 512)) {
    return false;
  }

  if (depth == 0) {
    DCOUT("current_working_path: " << cwp);
    DCOUT("search_paths: " << search_paths);
  }

  ps.set_asset_resolution_state(cwp, search_paths);

  for (auto &child : ps.children()) {
    if (!PropagateAssetResolverState(depth + 1, child, cwp, search_paths)) {
      return false;
    }
  }

  return true;
}